

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cpp::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *input,bool cap_next_letter)

{
  byte bVar1;
  int i;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 0;
  do {
    if (input->_M_string_length <= uVar2) {
      return __return_storage_ptr__;
    }
    bVar1 = (input->_M_dataplus)._M_p[uVar2];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((byte)(bVar1 - 0x30) < 10) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
      else if (bVar1 < 0x5b) goto LAB_00246c47;
    }
    else if (bVar1 < 0x7b) {
LAB_00246c47:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

string UnderscoresToCamelCase(const string& input, bool cap_next_letter) {
  string result;
  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      // Capital letters are left as-is.
      result += input[i];
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
    }
  }
  return result;
}